

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderAtomicCountersTests.cpp
# Opt level: O2

long __thiscall gl4cts::BasicProgramMax::Run(BasicProgramMax *this)

{
  bool bVar1;
  long lVar2;
  
  bVar1 = gl4cts::anon_unknown_0::SACSubcaseBase::CheckMaxValue
                    (&this->super_SACSubcaseBase,0x92dc,1);
  lVar2 = -1;
  if (bVar1) {
    bVar1 = gl4cts::anon_unknown_0::SACSubcaseBase::CheckMaxValue
                      (&this->super_SACSubcaseBase,0x92d8,0x20);
    if (bVar1) {
      bVar1 = gl4cts::anon_unknown_0::SACSubcaseBase::CheckMaxValue
                        (&this->super_SACSubcaseBase,0x92d1,1);
      if (bVar1) {
        bVar1 = gl4cts::anon_unknown_0::SACSubcaseBase::CheckMaxValue
                          (&this->super_SACSubcaseBase,0x92d7,8);
        if (bVar1) {
          bVar1 = gl4cts::anon_unknown_0::SACSubcaseBase::CheckMaxValue
                            (&this->super_SACSubcaseBase,0x92cc,0);
          if (bVar1) {
            bVar1 = gl4cts::anon_unknown_0::SACSubcaseBase::CheckMaxValue
                              (&this->super_SACSubcaseBase,0x92d2,0);
            if (bVar1) {
              bVar1 = gl4cts::anon_unknown_0::SACSubcaseBase::CheckMaxValue
                                (&this->super_SACSubcaseBase,0x92cd,0);
              if (bVar1) {
                bVar1 = gl4cts::anon_unknown_0::SACSubcaseBase::CheckMaxValue
                                  (&this->super_SACSubcaseBase,0x92d3,0);
                if (bVar1) {
                  bVar1 = gl4cts::anon_unknown_0::SACSubcaseBase::CheckMaxValue
                                    (&this->super_SACSubcaseBase,0x92ce,0);
                  if (bVar1) {
                    bVar1 = gl4cts::anon_unknown_0::SACSubcaseBase::CheckMaxValue
                                      (&this->super_SACSubcaseBase,0x92d4,0);
                    if (bVar1) {
                      bVar1 = gl4cts::anon_unknown_0::SACSubcaseBase::CheckMaxValue
                                        (&this->super_SACSubcaseBase,0x92cf,0);
                      if (bVar1) {
                        bVar1 = gl4cts::anon_unknown_0::SACSubcaseBase::CheckMaxValue
                                          (&this->super_SACSubcaseBase,0x92d5,0);
                        if (bVar1) {
                          bVar1 = gl4cts::anon_unknown_0::SACSubcaseBase::CheckMaxValue
                                            (&this->super_SACSubcaseBase,0x92d0,1);
                          if (bVar1) {
                            bVar1 = gl4cts::anon_unknown_0::SACSubcaseBase::CheckMaxValue
                                              (&this->super_SACSubcaseBase,0x92d6,8);
                            lVar2 = (ulong)bVar1 - 1;
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return lVar2;
}

Assistant:

virtual long Run()
	{
		if (!CheckMaxValue(GL_MAX_ATOMIC_COUNTER_BUFFER_BINDINGS, 1))
			return ERROR;
		if (!CheckMaxValue(GL_MAX_ATOMIC_COUNTER_BUFFER_SIZE, 32))
			return ERROR;
		if (!CheckMaxValue(GL_MAX_COMBINED_ATOMIC_COUNTER_BUFFERS, 1))
			return ERROR;
		if (!CheckMaxValue(GL_MAX_COMBINED_ATOMIC_COUNTERS, 8))
			return ERROR;
		if (!CheckMaxValue(GL_MAX_VERTEX_ATOMIC_COUNTER_BUFFERS, 0))
			return ERROR;
		if (!CheckMaxValue(GL_MAX_VERTEX_ATOMIC_COUNTERS, 0))
			return ERROR;
		if (!CheckMaxValue(GL_MAX_TESS_CONTROL_ATOMIC_COUNTER_BUFFERS, 0))
			return ERROR;
		if (!CheckMaxValue(GL_MAX_TESS_CONTROL_ATOMIC_COUNTERS, 0))
			return ERROR;
		if (!CheckMaxValue(GL_MAX_TESS_EVALUATION_ATOMIC_COUNTER_BUFFERS, 0))
			return ERROR;
		if (!CheckMaxValue(GL_MAX_TESS_EVALUATION_ATOMIC_COUNTERS, 0))
			return ERROR;
		if (!CheckMaxValue(GL_MAX_GEOMETRY_ATOMIC_COUNTER_BUFFERS, 0))
			return ERROR;
		if (!CheckMaxValue(GL_MAX_GEOMETRY_ATOMIC_COUNTERS, 0))
			return ERROR;
		if (!CheckMaxValue(GL_MAX_FRAGMENT_ATOMIC_COUNTER_BUFFERS, 1))
			return ERROR;
		if (!CheckMaxValue(GL_MAX_FRAGMENT_ATOMIC_COUNTERS, 8))
			return ERROR;
		return NO_ERROR;
	}